

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O2

Variable * __thiscall soul::Optimisations::Inliner::getRemappedVariable(Inliner *this,Variable *old)

{
  Module *this_00;
  string *psVar1;
  Allocator *this_01;
  mapped_type *this_02;
  string *psVar2;
  Variable *pVVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  Identifier local_38;
  
  if (old->role - mutableLocal < 3) {
    local_b8._M_dataplus._M_p = (pointer)old;
    this_02 = std::__detail::
              _Map_base<soul::pool_ref<soul::heart::Variable>,_std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<soul::pool_ref<soul::heart::Variable>,_std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->remappedVariables,(key_type *)&local_b8);
    if (this_02->object == (Variable *)0x0) {
      this_00 = this->module;
      psVar1 = (old->name).name;
      if (psVar1 == (string *)0x0) {
        local_38.name = (string *)0x0;
      }
      else {
        this_01 = this_00->allocator;
        std::operator+(&local_58,&this->inlinedFnName,"_");
        psVar2 = Identifier::operator_cast_to_string_(&old->name);
        std::__cxx11::string::string((string *)&local_98,(string *)psVar2);
        makeSafeIdentifierName(&local_78,&local_98);
        std::operator+(&local_b8,&local_58,&local_78);
        local_38 = heart::Allocator::get<std::__cxx11::string>(this_01,&local_b8);
      }
      pVVar3 = Module::
               allocate<soul::heart::Variable,soul::CodeLocation&,soul::Type&,soul::Identifier,soul::heart::Variable::Role&>
                         (this_00,&(old->super_Expression).super_Object.location,&old->type,
                          &local_38,&old->role);
      this_02->object = pVVar3;
      if (psVar1 != (string *)0x0) {
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_58);
      }
      pVVar3 = pool_ptr<soul::heart::Variable>::operator->(this_02);
      Annotation::operator=(&pVVar3->annotation,&old->annotation);
    }
    old = pool_ptr<soul::heart::Variable>::operator*(this_02);
  }
  return old;
}

Assistant:

heart::Variable& getRemappedVariable (heart::Variable& old)
        {
            if (old.isFunctionLocal() || old.isParameter())
            {
                auto& v = remappedVariables[old];

                if (v == nullptr)
                {
                    v = module.allocate<heart::Variable> (old.location, old.type,
                                                          old.name.isValid() ? module.allocator.get (inlinedFnName + "_" + makeSafeIdentifierName (old.name))
                                                                             : Identifier(),
                                                          old.role);
                    v->annotation = old.annotation;
                }

                return *v;
            }

            return old;
        }